

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<false,_false,_false>::push_block_
          (DaTrie<false,_false,_false> *this,uint32_t block_pos,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  pointer pBVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = block_pos << 8;
  if (this->bc_emps_ != 0) {
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar1[uVar2] =
         (Bc)((ulong)pBVar1[uVar2] & 0x80000000ffffffff |
             (ulong)pBVar1[this->head_pos_] & 0x7fffffff00000000);
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar1[uVar2 | 0xff] =
         (Bc)((ulong)(this->head_pos_ & 0x7fffffff) |
             (ulong)pBVar1[uVar2 | 0xff] & 0xffffffff00000000);
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (ulong)pBVar1[this->head_pos_] >> 0x1d & 0x3fffffff8;
    *(ulong *)(&pBVar1->field_0x0 + uVar3) =
         (ulong)(uVar2 & 0x7fffff00) | *(ulong *)(&pBVar1->field_0x0 + uVar3) & 0xffffffff00000000;
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar1[this->head_pos_] =
         (Bc)((ulong)pBVar1[this->head_pos_] & 0x80000000ffffffff |
             (ulong)(uVar2 & 0x7fffffff | 0xff) << 0x20);
    return;
  }
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1[uVar2 | 0xff] =
       (Bc)((ulong)(uVar2 & 0x7fffff00) | (ulong)pBVar1[uVar2 | 0xff] & 0xffffffff00000000);
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1[uVar2] =
       (Bc)((ulong)pBVar1[uVar2] & 0x80000000ffffffff | (ulong)(uVar2 & 0x7fffffff | 0xff) << 0x20);
  this->head_pos_ = uVar2;
  return;
}

Assistant:

void push_block_(uint32_t block_pos, std::vector<Block>& blocks) {
    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;

    if (bc_emps_ != 0) {
      set_prev_(begin, prev_(head_pos_));
      set_next_(end - 1, head_pos_);
      set_next_(prev_(head_pos_), begin);
      set_prev_(head_pos_, end - 1);
    } else {
      set_next_(end - 1, begin);
      set_prev_(begin, end - 1);
      head_pos_ = begin;
    }
  }